

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOptions
          (Parser *this,LocationRecorder *parent_location,int optionsFieldNumber,
          Message *mutable_options)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  LocationRecorder location;
  LocationRecorder local_58;
  Tokenizer *local_48;
  SourceCodeInfo *local_38;
  
  local_38 = (SourceCodeInfo *)mutable_options;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
  while( true ) {
    if (bVar2) {
      return true;
    }
    if ((this->input_->current_).type == TYPE_END) break;
    bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
    if (!bVar2) {
      LocationRecorder::LocationRecorder(&local_58,parent_location,optionsFieldNumber);
      bVar2 = ParseOption(this,&local_38->super_Message,&local_58,OPTION_STATEMENT);
      if (!bVar2) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder(&local_58);
    }
    bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
  }
  local_58.parser_ = (Parser *)&stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Reached end of input in method options (missing \'}\').","");
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,(ulong)(uint)(this->input_->current_).line,
               (ulong)(uint)(this->input_->current_).column);
  }
  this->had_errors_ = true;
  if (local_58.parser_ != (Parser *)&stack0xffffffffffffffb8) {
    operator_delete(local_58.parser_,(ulong)((long)&(local_48->current_).type + 1));
  }
  return false;
}

Assistant:

bool Parser::ParseOptions(const LocationRecorder& parent_location,
                          const int optionsFieldNumber,
                          Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location,
                                optionsFieldNumber);
      if (!ParseOption(mutable_options, location, OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}